

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase1102::TestCase1102(TestCase1102 *this)

{
  TestCase1102 *this_local;
  
  TestCase::TestCase(&this->super_TestCase,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                     ,0x44e,"legacy test: Async/LargeTaskSetClearException");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_00bf0478;
  return;
}

Assistant:

TEST(Async, LargeTaskSetClearException) {
  size_t stackSize = getSmallStackSize();

  runWithStackLimit(stackSize, [stackSize]() {
    class ThrowingDestructor: public UnwindDetector {
    public:
      ~ThrowingDestructor() noexcept(false) {
        catchExceptionsIfUnwinding([]() {
          KJ_FAIL_ASSERT("ThrowingDestructor_exception");
        });
      }
    };
    ErrorHandlerImpl errorHandler;
    TaskSet tasks(errorHandler);

    for (int i = 0; i < stackSize / sizeof(void*); i++) {
      tasks.add(kj::Promise<void>(kj::NEVER_DONE).attach(kj::heap<ThrowingDestructor>()));
    }

    KJ_EXPECT_THROW_MESSAGE("ThrowingDestructor_exception", { tasks.clear(); });
  });
}